

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O1

void botpHOTPStepR(char *otp,void *state)

{
  void *dest;
  size_t sVar1;
  size_t count;
  
  dest = (void *)((long)state + 0x42);
  sVar1 = beltHMAC_keep();
  count = beltHMAC_keep();
  memCopy(dest,(void *)((long)state + sVar1 + 0x42),count);
  beltHMACStepA((octet *)((long)state + 8),8,dest);
  beltHMACStepG((octet *)((long)state + 0x18),dest);
  botpDT(otp,*state,(octet *)((long)state + 0x18),0x20);
  botpCtrNext((octet *)((long)state + 8));
  return;
}

Assistant:

void botpHOTPStepR(char* otp, void* state)
{
	botp_hotp_st* st = (botp_hotp_st*)state;
	// pre
	ASSERT(memIsDisjoint2(otp, st->digit + 1, state, botpHOTP_keep()) || 
		otp == st->otp);
	// вычислить имитовставку
	memCopy(st->stack, st->stack + beltHMAC_keep(), beltHMAC_keep());
	beltHMACStepA(st->ctr, 8, st->stack);
	beltHMACStepG(st->mac, st->stack);
	// построить пароль
	botpDT(otp, st->digit, st->mac, 32);
	// инкремент счетчика
	botpCtrNext(st->ctr);
}